

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

size_t stackjit::TypeSystem::sizeOfType(PrimitiveTypes primitiveType)

{
  if ((byte)(primitiveType - Integer) < 4) {
    return *(size_t *)(&DAT_0017fa58 + (ulong)(byte)(primitiveType - Integer) * 8);
  }
  return 0;
}

Assistant:

std::size_t TypeSystem::sizeOfType(PrimitiveTypes primitiveType) {
		switch (primitiveType) {
		case PrimitiveTypes::Void:
			return 0;
		case PrimitiveTypes::Integer:
			return 4;
		case PrimitiveTypes::Float:
			return 4;
		case PrimitiveTypes::Bool:
			return 1;
		case PrimitiveTypes::Char:
			return 1;
		}

		return 0;
	}